

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::MergeFrom
          (ItemSimilarityRecommender *this,ItemSimilarityRecommender *from)

{
  ulong uVar1;
  LogMessage *other;
  StringVector *this_00;
  Int64Vector *this_01;
  undefined8 *puVar2;
  ulong uVar3;
  undefined1 *puVar4;
  Arena *pAVar5;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/ItemSimilarityRecommender.pb.cc"
               ,0x40b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::TypeHandler>
            (&(this->itemitemsimilarities_).super_RepeatedPtrFieldBase,
             &(from->itemitemsimilarities_).super_RepeatedPtrFieldBase);
  uVar3 = (ulong)(from->iteminputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->iteminputfeaturename_,uVar3,puVar2);
  }
  uVar3 = (ulong)(from->numrecommendationsinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->numrecommendationsinputfeaturename_,uVar3,puVar2);
  }
  uVar3 = (ulong)(from->itemrestrictioninputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->itemrestrictioninputfeaturename_,uVar3,puVar2);
  }
  uVar3 = (ulong)(from->itemexclusioninputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->itemexclusioninputfeaturename_,uVar3,puVar2);
  }
  uVar3 = (ulong)(from->recommendeditemlistoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe
  ;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->recommendeditemlistoutputfeaturename_,uVar3,puVar2);
  }
  uVar3 = (ulong)(from->recommendeditemscoreoutputfeaturename_).tagged_ptr_.ptr_ &
          0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->recommendeditemscoreoutputfeaturename_,uVar3,puVar2);
  }
  puVar4 = (undefined1 *)from->itemstringids_;
  if ((StringVector *)puVar4 != (StringVector *)0x0 &&
      from != (ItemSimilarityRecommender *)_ItemSimilarityRecommender_default_instance_) {
    this_00 = this->itemstringids_;
    if (this_00 == (StringVector *)0x0) {
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                          (pAVar5);
      this->itemstringids_ = this_00;
      puVar4 = (undefined1 *)from->itemstringids_;
    }
    if ((StringVector *)puVar4 == (StringVector *)0x0) {
      puVar4 = _StringVector_default_instance_;
    }
    StringVector::MergeFrom(this_00,(StringVector *)puVar4);
  }
  puVar4 = (undefined1 *)from->itemint64ids_;
  if ((Int64Vector *)puVar4 != (Int64Vector *)0x0 &&
      from != (ItemSimilarityRecommender *)_ItemSimilarityRecommender_default_instance_) {
    this_01 = this->itemint64ids_;
    if (this_01 == (Int64Vector *)0x0) {
      uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                          (pAVar5);
      this->itemint64ids_ = this_01;
      puVar4 = (undefined1 *)from->itemint64ids_;
    }
    if ((Int64Vector *)puVar4 == (Int64Vector *)0x0) {
      puVar4 = _Int64Vector_default_instance_;
    }
    Int64Vector::MergeFrom(this_01,(Int64Vector *)puVar4);
  }
  uVar3 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar3 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void ItemSimilarityRecommender::MergeFrom(const ItemSimilarityRecommender& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ItemSimilarityRecommender)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  itemitemsimilarities_.MergeFrom(from.itemitemsimilarities_);
  if (!from._internal_iteminputfeaturename().empty()) {
    _internal_set_iteminputfeaturename(from._internal_iteminputfeaturename());
  }
  if (!from._internal_numrecommendationsinputfeaturename().empty()) {
    _internal_set_numrecommendationsinputfeaturename(from._internal_numrecommendationsinputfeaturename());
  }
  if (!from._internal_itemrestrictioninputfeaturename().empty()) {
    _internal_set_itemrestrictioninputfeaturename(from._internal_itemrestrictioninputfeaturename());
  }
  if (!from._internal_itemexclusioninputfeaturename().empty()) {
    _internal_set_itemexclusioninputfeaturename(from._internal_itemexclusioninputfeaturename());
  }
  if (!from._internal_recommendeditemlistoutputfeaturename().empty()) {
    _internal_set_recommendeditemlistoutputfeaturename(from._internal_recommendeditemlistoutputfeaturename());
  }
  if (!from._internal_recommendeditemscoreoutputfeaturename().empty()) {
    _internal_set_recommendeditemscoreoutputfeaturename(from._internal_recommendeditemscoreoutputfeaturename());
  }
  if (from._internal_has_itemstringids()) {
    _internal_mutable_itemstringids()->::CoreML::Specification::StringVector::MergeFrom(from._internal_itemstringids());
  }
  if (from._internal_has_itemint64ids()) {
    _internal_mutable_itemint64ids()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_itemint64ids());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}